

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

int pcmp_ilen(ZMMReg *r,uint8_t ctrl)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  if ((ctrl & 1) == 0) {
    iVar1 = 0x10;
    for (; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      if (r->_b_ZMMReg[lVar2] == '\0') {
LAB_004d312b:
        return (int)lVar2;
      }
    }
  }
  else {
    iVar1 = 8;
    for (; lVar2 != 8; lVar2 = lVar2 + 1) {
      if (r->_w_ZMMReg[lVar2] == 0) goto LAB_004d312b;
    }
  }
  return iVar1;
}

Assistant:

static inline int pcmp_ilen(Reg *r, uint8_t ctrl)
{
    int val = 0;

    if (ctrl & 1) {
        while (val < 8 && r->W(val)) {
            val++;
        }
    } else {
        while (val < 16 && r->B(val)) {
            val++;
        }
    }

    return val;
}